

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::LogToStderr(void)

{
  LogSeverity local_c;
  int i;
  
  SetStderrLogging(GLOG_INFO);
  for (local_c = GLOG_INFO; (int)local_c < 4; local_c = local_c + GLOG_WARNING) {
    SetLogDestination(local_c,"");
  }
  return;
}

Assistant:

inline void LogDestination::LogToStderr() {
  // *Don't* put this stuff in a mutex lock, since SetStderrLogging &
  // SetLogDestination already do the locking!
  SetStderrLogging(GLOG_INFO);  // thus everything is "also" logged to stderr
  for (int i = 0; i < NUM_SEVERITIES; ++i) {
    SetLogDestination(static_cast<LogSeverity>(i),
                      "");  // "" turns off logging to a logfile
  }
}